

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImRect *pIVar1;
  float fVar2;
  int iVar3;
  ImGuiWindow *window;
  ImGuiColumnData *pIVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiID id;
  ImGuiColumns *pIVar7;
  ImGuiColumnData *pIVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int n;
  long lVar12;
  int iVar13;
  ImGuiContext *g;
  ulong uVar14;
  bool bVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar6 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (columns_count < 1) {
    __assert_fail("columns_count >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imgui_widgets.cpp"
                  ,0x1c87,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((window->DC).CurrentColumns == (ImGuiColumns *)0x0) {
    id = GetColumnsID(str_id,columns_count);
    pIVar7 = FindOrCreateColumns(window,id);
    if (pIVar7->ID != id) {
      __assert_fail("columns->ID == id",
                    "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imgui_widgets.cpp"
                    ,0x1c8d,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
    }
    pIVar7->Current = 0;
    pIVar7->Count = columns_count;
    pIVar7->Flags = flags;
    (window->DC).CurrentColumns = pIVar7;
    pIVar7->HostCursorPosY = (window->DC).CursorPos.y;
    pIVar7->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
    IVar5 = (window->ClipRect).Max;
    (pIVar7->HostClipRect).Min = (window->ClipRect).Min;
    (pIVar7->HostClipRect).Max = IVar5;
    IVar5 = (window->WorkRect).Max;
    (pIVar7->HostWorkRect).Min = (window->WorkRect).Min;
    (pIVar7->HostWorkRect).Max = IVar5;
    fVar2 = (pIVar6->Style).ItemSpacing.x;
    fVar17 = (window->WindowPadding).x;
    fVar20 = fVar2 - fVar17;
    fVar17 = fVar17 * 0.5;
    uVar16 = -(uint)(window->WindowBorderSize <= fVar17);
    fVar18 = (window->WorkRect).Max.x;
    fVar20 = (float)(-(uint)(0.0 <= fVar20) & (uint)fVar20);
    fVar21 = (fVar2 + fVar18) - fVar20;
    fVar18 = (float)(int)(float)(~uVar16 & (uint)window->WindowBorderSize | (uint)fVar17 & uVar16) +
             fVar18;
    if (fVar18 <= fVar21) {
      fVar21 = fVar18;
    }
    fVar20 = ((window->DC).Indent.x - fVar2) + fVar20;
    pIVar7->OffMinX = fVar20;
    fVar21 = fVar21 - (window->Pos).x;
    fVar20 = fVar20 + 1.0;
    uVar16 = -(uint)(fVar20 <= fVar21);
    pIVar7->OffMaxX = (float)(~uVar16 & (uint)fVar20 | (uint)fVar21 & uVar16);
    fVar17 = (window->DC).CursorPos.y;
    pIVar7->LineMaxY = fVar17;
    pIVar7->LineMinY = fVar17;
    uVar16 = (pIVar7->Columns).Size;
    uVar10 = columns_count + 1;
    if (uVar16 != uVar10 && uVar16 != 0) {
      iVar13 = (pIVar7->Columns).Capacity;
      if (iVar13 < 0) {
        uVar16 = iVar13 / 2 + iVar13;
        uVar11 = 0;
        if (0 < (int)uVar16) {
          uVar11 = (ulong)uVar16;
        }
        pIVar8 = (ImGuiColumnData *)MemAlloc(uVar11 * 0x1c);
        pIVar4 = (pIVar7->Columns).Data;
        if (pIVar4 != (ImGuiColumnData *)0x0) {
          memcpy(pIVar8,pIVar4,(long)(pIVar7->Columns).Size * 0x1c);
          MemFree((pIVar7->Columns).Data);
        }
        (pIVar7->Columns).Data = pIVar8;
        (pIVar7->Columns).Capacity = (int)uVar11;
      }
      (pIVar7->Columns).Size = 0;
    }
    bVar15 = (pIVar7->Columns).Size == 0;
    pIVar7->IsFirstFrame = bVar15;
    if (bVar15) {
      if ((pIVar7->Columns).Capacity <= columns_count) {
        pIVar8 = (ImGuiColumnData *)MemAlloc((ulong)uVar10 * 0x1c);
        pIVar4 = (pIVar7->Columns).Data;
        if (pIVar4 != (ImGuiColumnData *)0x0) {
          memcpy(pIVar8,pIVar4,(long)(pIVar7->Columns).Size * 0x1c);
          MemFree((pIVar7->Columns).Data);
        }
        (pIVar7->Columns).Data = pIVar8;
        (pIVar7->Columns).Capacity = uVar10;
      }
      uVar16 = 0;
      do {
        iVar13 = (pIVar7->Columns).Size;
        iVar3 = (pIVar7->Columns).Capacity;
        if (iVar13 == iVar3) {
          if (iVar3 == 0) {
            iVar9 = 8;
          }
          else {
            iVar9 = iVar3 / 2 + iVar3;
          }
          iVar13 = iVar13 + 1;
          if (iVar13 < iVar9) {
            iVar13 = iVar9;
          }
          if (iVar3 < iVar13) {
            pIVar8 = (ImGuiColumnData *)MemAlloc((long)iVar13 * 0x1c);
            pIVar4 = (pIVar7->Columns).Data;
            if (pIVar4 != (ImGuiColumnData *)0x0) {
              memcpy(pIVar8,pIVar4,(long)(pIVar7->Columns).Size * 0x1c);
              MemFree((pIVar7->Columns).Data);
            }
            (pIVar7->Columns).Data = pIVar8;
            (pIVar7->Columns).Capacity = iVar13;
          }
        }
        pIVar4 = (pIVar7->Columns).Data;
        iVar13 = (pIVar7->Columns).Size;
        pIVar4[iVar13].OffsetNorm = (float)(int)uVar16 / (float)columns_count;
        pIVar4[iVar13].OffsetNormBeforeResize = 0.0;
        pIVar4[iVar13].Flags = 0;
        pIVar1 = &pIVar4[iVar13].ClipRect;
        (pIVar1->Min).x = 3.4028235e+38;
        (pIVar1->Min).y = 3.4028235e+38;
        (pIVar1->Max).x = -3.4028235e+38;
        (pIVar1->Max).y = -3.4028235e+38;
        (pIVar7->Columns).Size = (pIVar7->Columns).Size + 1;
        uVar16 = uVar16 + 1;
      } while (uVar10 != uVar16);
    }
    uVar11 = 1;
    if (1 < columns_count) {
      uVar11 = (ulong)(uint)columns_count;
    }
    lVar12 = 0xc;
    uVar14 = 0;
    do {
      if ((long)(pIVar7->Columns).Size <= (long)uVar14) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imgui.h"
                      ,0x4d8,"T &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
      }
      pIVar4 = (pIVar7->Columns).Data;
      fVar17 = (window->Pos).x;
      fVar18 = GetColumnOffset((int)uVar14);
      fVar19 = (float)(int)(fVar18 + fVar17 + 0.5);
      fVar17 = (window->Pos).x;
      uVar14 = uVar14 + 1;
      fVar18 = GetColumnOffset((int)uVar14);
      fVar20 = (float)(int)(fVar18 + fVar17 + 0.5 + -1.0);
      *(float *)((long)&pIVar4->OffsetNorm + lVar12) = fVar19;
      *(undefined4 *)((long)&pIVar4->OffsetNormBeforeResize + lVar12) = 0xff7fffff;
      *(float *)((long)&pIVar4->Flags + lVar12) = fVar20;
      *(undefined4 *)((long)&(pIVar4->ClipRect).Min.x + lVar12) = 0x7f7fffff;
      fVar17 = (window->ClipRect).Min.x;
      uVar16 = -(uint)(fVar17 <= fVar19);
      fVar18 = (window->ClipRect).Min.y;
      fVar21 = -3.4028235e+38;
      if (-3.4028235e+38 <= fVar18) {
        fVar21 = fVar18;
      }
      *(ulong *)((long)&pIVar4->OffsetNorm + lVar12) =
           CONCAT44(fVar21,~uVar16 & (uint)fVar17 | (uint)fVar19 & uVar16);
      fVar17 = (window->ClipRect).Max.x;
      if (fVar17 <= fVar20) {
        fVar20 = fVar17;
      }
      fVar17 = (window->ClipRect).Max.y;
      fVar18 = 3.4028235e+38;
      if (fVar17 <= 3.4028235e+38) {
        fVar18 = fVar17;
      }
      *(ulong *)((long)&pIVar4->Flags + lVar12) = CONCAT44(fVar18,fVar20);
      lVar12 = lVar12 + 0x1c;
    } while (uVar11 != uVar14);
    if (1 < pIVar7->Count) {
      ImDrawListSplitter::Split(&window->DrawList->_Splitter,window->DrawList,pIVar7->Count + 1);
      ImDrawListSplitter::SetCurrentChannel(&window->DrawList->_Splitter,window->DrawList,1);
      PushColumnClipRect(0);
    }
    fVar17 = GetColumnOffset(pIVar7->Current);
    fVar18 = GetColumnOffset(pIVar7->Current + 1);
    PushItemWidth((fVar18 - fVar17) * 0.65);
    fVar21 = fVar2 - (window->WindowPadding).x;
    fVar21 = (float)(-(uint)(0.0 <= fVar21) & (uint)fVar21);
    (window->DC).ColumnsOffset.x = fVar21;
    fVar17 = (window->Pos).x;
    (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar17 + fVar21);
    (window->WorkRect).Max.x = (fVar18 + fVar17) - fVar2;
    return;
  }
  __assert_fail("window->DC.CurrentColumns == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/imgui_widgets.cpp"
                ,0x1c88,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1);
    IM_ASSERT(window->DC.CurrentColumns == NULL); // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n));
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        window->DrawList->ChannelsSplit(1 + columns->Count);
        window->DrawList->ChannelsSetCurrent(1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}